

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_ExtractPubkeysFromMultisigScript_Test::TestBody
          (ScriptUtil_ExtractPubkeysFromMultisigScript_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  reference pvVar4;
  AssertHelper local_580;
  Message local_578 [2];
  CfdException *anon_var_0;
  byte local_549;
  char *pcStack_548;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_538;
  undefined1 local_518 [8];
  Script illegal_script;
  Message local_4d8;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_16;
  Message local_498;
  string local_490;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_15;
  Message local_458;
  string local_450;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_14;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_13;
  Message local_3d8;
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_12;
  Message local_398;
  string local_390;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_11;
  Message local_358;
  string local_350;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_10;
  Message local_318;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_9;
  Message local_2d8;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_7;
  Message local_258;
  string local_250;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_6;
  Message local_218;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  string local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  int local_e4;
  size_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  Message local_c0 [2];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_b0;
  undefined1 local_98 [8];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  uint32_t reqnum;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  Script script;
  ScriptUtil_ExtractPubkeysFromMultisigScript_Test *this_local;
  
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,
             "5e2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec521032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db21030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a1432102927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a2102ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e72102ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c12102b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f22103f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e6021022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc2102e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d2103c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c2102063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d821033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a5572103a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa2102818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c45fae"
             ,&local_69);
  cfd::core::Script::Script((Script *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
                (&local_b0,(Script *)local_48,
                 (uint32_t *)
                 &pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator=
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,&local_b0
                );
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_b0);
    }
  }
  else {
    testing::Message::Message(local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f0,
               "Expected: pubkeys = ScriptUtil::ExtractPubkeysFromMultisigScript(script, &reqnum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_c0);
  }
  local_e0 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98);
  local_e4 = 0xf;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_d8,"pubkeys.size()","15",&local_e0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_10c = 0xe;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_108,"reqnum","14",
             (uint *)&pubkeys.
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x1f2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  sVar3 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::size
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98);
  if (sVar3 == 0xf) {
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,0)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_150,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_130,"pubkeys[0].GetHex().c_str()",
               "\"02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5\"",pcVar2,
               "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5");
    std::__cxx11::string::~string((string *)&local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,1)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_190,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_170,"pubkeys[1].GetHex().c_str()",
               "\"032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db\"",pcVar2,
               "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
    std::__cxx11::string::~string((string *)&local_190);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f7,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,2)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1d0,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1b0,"pubkeys[2].GetHex().c_str()",
               "\"030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143\"",pcVar2,
               "030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143");
    std::__cxx11::string::~string((string *)&local_1d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1f9,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,3)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_210,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_1f0,"pubkeys[3].GetHex().c_str()",
               "\"02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a\"",pcVar2,
               "02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a");
    std::__cxx11::string::~string((string *)&local_210);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_218);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1fb,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_218);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,4)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_250,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_230,"pubkeys[4].GetHex().c_str()",
               "\"02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7\"",pcVar2,
               "02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7");
    std::__cxx11::string::~string((string *)&local_250);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1fd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,5)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_290,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_270,"pubkeys[5].GetHex().c_str()",
               "\"02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1\"",pcVar2,
               "02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1");
    std::__cxx11::string::~string((string *)&local_290);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1ff,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_298);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_298);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,6)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_2d0,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_2b0,"pubkeys[6].GetHex().c_str()",
               "\"02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2\"",pcVar2,
               "02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2");
    std::__cxx11::string::~string((string *)&local_2d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x201,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_2d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,7)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_310,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_2f0,"pubkeys[7].GetHex().c_str()",
               "\"03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60\"",pcVar2,
               "03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60");
    std::__cxx11::string::~string((string *)&local_310);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x203,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,8)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_350,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_330,"pubkeys[8].GetHex().c_str()",
               "\"022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc\"",pcVar2,
               "022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc");
    std::__cxx11::string::~string((string *)&local_350);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x205,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_358);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,9)
    ;
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_390,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_370,"pubkeys[9].GetHex().c_str()",
               "\"02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d\"",pcVar2,
               "02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d");
    std::__cxx11::string::~string((string *)&local_390);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar1) {
      testing::Message::Message(&local_398);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x207,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_398);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,10
                       );
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_3d0,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_3b0,"pubkeys[10].GetHex().c_str()",
               "\"03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c\"",pcVar2,
               "03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c");
    std::__cxx11::string::~string((string *)&local_3d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x209,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,
                        0xb);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_410,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_3f0,"pubkeys[11].GetHex().c_str()",
               "\"02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8\"",pcVar2,
               "02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8");
    std::__cxx11::string::~string((string *)&local_410);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_418);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_418);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_418);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,
                        0xc);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_450,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_430,"pubkeys[12].GetHex().c_str()",
               "\"033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557\"",pcVar2,
               "033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557");
    std::__cxx11::string::~string((string *)&local_450);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      testing::Message::Message(&local_458);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_458);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_458);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,
                        0xd);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_490,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_470,"pubkeys[13].GetHex().c_str()",
               "\"03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa\"",pcVar2,
               "03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa");
    std::__cxx11::string::~string((string *)&local_490);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
    if (!bVar1) {
      testing::Message::Message(&local_498);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x20f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_498);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
    pvVar4 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator[]
                       ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98,
                        0xe);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_4d0,pvVar4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_4b0,"pubkeys[14].GetHex().c_str()",
               "\"02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4\"",pcVar2,
               "02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4");
    std::__cxx11::string::~string((string *)&local_4d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
    if (!bVar1) {
      testing::Message::Message(&local_4d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &illegal_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x211,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &illegal_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4d8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &illegal_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_4d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_538,
             "210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac",
             (allocator *)((long)&gtest_msg.value + 7));
  cfd::core::Script::Script((Script *)local_518,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffab8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffab8);
  if (bVar1) {
    local_549 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&anon_var_0,
                 (Script *)local_518,
                 (uint32_t *)
                 &pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&anon_var_0);
    }
    if ((local_549 & 1) != 0) goto LAB_003efa3a;
    pcStack_548 = 
    "Expected: ScriptUtil::ExtractPubkeysFromMultisigScript(illegal_script, &reqnum) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_578);
  testing::internal::AssertHelper::AssertHelper
            (&local_580,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
             ,0x216,pcStack_548);
  testing::internal::AssertHelper::operator=(&local_580,local_578);
  testing::internal::AssertHelper::~AssertHelper(&local_580);
  testing::Message::~Message(local_578);
LAB_003efa3a:
  cfd::core::Script::~Script((Script *)local_518);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_98);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(ScriptUtil, ExtractPubkeysFromMultisigScript) {
  // valid script data
  Script script("5e2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec521032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db21030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a1432102927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a2102ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e72102ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c12102b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f22103f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e6021022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc2102e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d2103c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c2102063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d821033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a5572103a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa2102818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c45fae");
  uint32_t reqnum = 0;
  std::vector<Pubkey> pubkeys;
  EXPECT_NO_THROW(pubkeys = ScriptUtil::ExtractPubkeysFromMultisigScript(script, &reqnum));
  EXPECT_EQ(pubkeys.size(), 15);
  EXPECT_EQ(reqnum, 14);
  if (pubkeys.size() == 15) {
    EXPECT_STREQ(pubkeys[0].GetHex().c_str(),
        "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5");
    EXPECT_STREQ(pubkeys[1].GetHex().c_str(),
        "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
    EXPECT_STREQ(pubkeys[2].GetHex().c_str(),
        "030dc96ba9b0dcce41a4b683164af15c045f0b169da1d1e234611a8cfc3195a143");
    EXPECT_STREQ(pubkeys[3].GetHex().c_str(),
        "02927b60e6bdbd728009e7e19feb4700a04f25328929730a609471b8e236ff050a");
    EXPECT_STREQ(pubkeys[4].GetHex().c_str(),
        "02ff43fd9fdb705d223951806f349dd2090edc4d971eb1c2a60c48cfb2af2862e7");
    EXPECT_STREQ(pubkeys[5].GetHex().c_str(),
        "02ce1316489880a77407f9637af4e806c5a7e731b45504d6f3fca506b207f8e3c1");
    EXPECT_STREQ(pubkeys[6].GetHex().c_str(),
        "02b12d700c4d851f773c55d17d9f59bf689a7cbdc01450c8679de9702fc77ac4f2");
    EXPECT_STREQ(pubkeys[7].GetHex().c_str(),
        "03f6d4cfd7688da7a130ea0f6bd7ecaa6e7ae868ae8614cd746c26b1cb9e808e60");
    EXPECT_STREQ(pubkeys[8].GetHex().c_str(),
        "022ac6940d159cd39b36cb4a2ec34fb2696e085be634ce1e7b5fcc118a6ac5e2cc");
    EXPECT_STREQ(pubkeys[9].GetHex().c_str(),
        "02e9662b666479ed7117aa76fb96f322a84408d0882707b301c7450098d439680d");
    EXPECT_STREQ(pubkeys[10].GetHex().c_str(),
        "03c0230a322f70675bef21097242ac70647798826588e47eca14e5715cef77008c");
    EXPECT_STREQ(pubkeys[11].GetHex().c_str(),
        "02063566b61b4754dc2956b3571bdce889decc23c789d6b58df0057808b20e66d8");
    EXPECT_STREQ(pubkeys[12].GetHex().c_str(),
        "033acbe038580c25da0c0c6e94c4dcbfa9c09f2f3bff59ae16aebfbd35a238a557");
    EXPECT_STREQ(pubkeys[13].GetHex().c_str(),
        "03a1423fc026f41f3f786db98a793802f77819e33692301ed24426e6dbad05aeaa");
    EXPECT_STREQ(pubkeys[14].GetHex().c_str(),
        "02818c3deec9c1f717cd6d97d2d9cf6cedfc9d97114fc6894ef71d4e1f69d859c4");
  }

  Script illegal_script("210279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798ac");
  EXPECT_THROW(ScriptUtil::ExtractPubkeysFromMultisigScript(illegal_script, &reqnum),
      CfdException);
}